

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl_rtc.cc
# Opt level: O0

AV1LoopfilterLevel __thiscall aom::AV1RateControlRTC::GetLoopfilterLevel(AV1RateControlRTC *this)

{
  AV1LoopfilterLevel AVar1;
  long *in_RDI;
  AV1LoopfilterLevel lpf_level;
  LPF_PICK_METHOD in_stack_00000117;
  AV1_COMP *in_stack_00000118;
  YV12_BUFFER_CONFIG *in_stack_00000120;
  
  av1_pick_filter_level(in_stack_00000120,in_stack_00000118,in_stack_00000117);
  AVar1.filter_level[1] = *(undefined4 *)(*in_RDI + 0x41974);
  AVar1.filter_level[0] = *(undefined4 *)(*in_RDI + 0x41970);
  AVar1.filter_level_u = *(undefined4 *)(*in_RDI + 0x41978);
  AVar1.filter_level_v = *(int *)(*in_RDI + 0x4197c);
  return AVar1;
}

Assistant:

AV1LoopfilterLevel AV1RateControlRTC::GetLoopfilterLevel() const {
  av1_pick_filter_level(nullptr, cpi_, LPF_PICK_FROM_Q);
  AV1LoopfilterLevel lpf_level;
  lpf_level.filter_level[0] = cpi_->common.lf.filter_level[0];
  lpf_level.filter_level[1] = cpi_->common.lf.filter_level[1];
  lpf_level.filter_level_u = cpi_->common.lf.filter_level_u;
  lpf_level.filter_level_v = cpi_->common.lf.filter_level_v;
  return lpf_level;
}